

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_statistics.cpp
# Opt level: O1

BaseStatistics *
duckdb::BaseStatistics::FromConstant(BaseStatistics *__return_storage_ptr__,Value *input)

{
  FromConstantType(__return_storage_ptr__,input);
  __return_storage_ptr__->distinct_count = 1;
  if (input->is_null == true) {
    SetHasNull(__return_storage_ptr__);
    __return_storage_ptr__->has_no_null = false;
  }
  else {
    __return_storage_ptr__->has_null = false;
    SetHasNoNull(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

BaseStatistics BaseStatistics::FromConstant(const Value &input) {
	auto result = FromConstantType(input);
	result.SetDistinctCount(1);
	if (input.IsNull()) {
		result.Set(StatsInfo::CAN_HAVE_NULL_VALUES);
		result.Set(StatsInfo::CANNOT_HAVE_VALID_VALUES);
	} else {
		result.Set(StatsInfo::CANNOT_HAVE_NULL_VALUES);
		result.Set(StatsInfo::CAN_HAVE_VALID_VALUES);
	}
	return result;
}